

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

unsigned_short tinyexr::forwardLutFromBitmap(uchar *bitmap,unsigned_short *lut)

{
  unsigned_short uVar1;
  int i;
  ulong uVar2;
  unsigned_short uVar3;
  
  uVar2 = 0;
  uVar1 = 0;
  do {
    if (uVar2 == 0) {
LAB_00121391:
      uVar3 = uVar1;
      uVar1 = uVar1 + 1;
    }
    else {
      if (uVar2 == 0x10000) {
        return uVar1 - 1;
      }
      if ((bitmap[uVar2 >> 3 & 0x1fffffff] >> ((uint)uVar2 & 7) & 1) != 0) goto LAB_00121391;
      uVar3 = 0;
    }
    lut[uVar2] = uVar3;
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

unsigned short forwardLutFromBitmap(const unsigned char bitmap[BITMAP_SIZE],
                                    unsigned short lut[USHORT_RANGE]) {
  int k = 0;

  for (int i = 0; i < USHORT_RANGE; ++i) {
    if ((i == 0) || (bitmap[i >> 3] & (1 << (i & 7))))
      lut[i] = k++;
    else
      lut[i] = 0;
  }

  return k - 1;  // maximum value stored in lut[],
}